

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_appender<char>
fmt::v11::detail::fill<char,fmt::v11::basic_appender<char>>
          (basic_appender<char> it,size_t n,basic_specs *specs)

{
  basic_specs *count;
  char *begin;
  basic_specs *local_50;
  size_t i;
  char *data;
  basic_appender<char> local_38;
  size_t local_30;
  size_t fill_size;
  basic_specs *specs_local;
  size_t n_local;
  basic_appender<char> it_local;
  
  fill_size = (size_t)specs;
  specs_local = (basic_specs *)n;
  n_local = (size_t)it.container;
  local_30 = basic_specs::fill_size(specs);
  count = specs_local;
  if (local_30 == 1) {
    local_38.container = (buffer<char> *)n_local;
    data._7_1_ = basic_specs::fill_unit<char>((basic_specs *)fill_size);
    it_local = fill_n<fmt::v11::basic_appender<char>,unsigned_long,char>
                         (local_38,(unsigned_long)count,(char *)((long)&data + 7));
  }
  else {
    begin = basic_specs::fill<char,_0>((basic_specs *)fill_size);
    if (begin != (char *)0x0) {
      for (local_50 = (basic_specs *)0x0; local_50 < specs_local;
          local_50 = (basic_specs *)((long)&local_50->data_ + 1)) {
        n_local = (size_t)copy<char,_const_char_*,_fmt::v11::basic_appender<char>,_0>
                                    (begin,begin + local_30,(basic_appender<char>)n_local);
      }
    }
    it_local.container = (buffer<char> *)n_local;
  }
  return (basic_appender<char>)it_local.container;
}

Assistant:

FMT_CONSTEXPR FMT_NOINLINE auto fill(OutputIt it, size_t n,
                                     const basic_specs& specs) -> OutputIt {
  auto fill_size = specs.fill_size();
  if (fill_size == 1) return detail::fill_n(it, n, specs.fill_unit<Char>());
  if (const Char* data = specs.fill<Char>()) {
    for (size_t i = 0; i < n; ++i) it = copy<Char>(data, data + fill_size, it);
  }
  return it;
}